

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexical.h
# Opt level: O1

Node * __thiscall
Lexical::variableDesProgram(Node *__return_storage_ptr__,Lexical *this,int *nowProcedure)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int *to_;
  pointer *ppiVar2;
  int *nowProcedure_00;
  bool bVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  int beginIndex;
  int varIndex;
  Node now;
  Node varIdentifier;
  int local_150;
  int local_14c;
  undefined1 local_148 [40];
  Node local_120;
  int local_d8;
  int local_d4;
  Node *local_d0;
  int *local_c8;
  undefined1 local_c0 [40];
  vector<Node,_std::allocator<Node>_> local_98;
  int local_80;
  int iStack_7c;
  Node local_78;
  
  Generator::pushIndex(&this->generator);
  local_14c = this->wordIndex;
  this->wordIndex = (int)((long)local_14c + 1);
  iVar4 = std::__cxx11::string::compare
                    ((char *)((this->words).super__Vector_base<Word,_std::allocator<Word>_>._M_impl.
                              super__Vector_impl_data._M_start + (long)local_14c + 1));
  if (iVar4 == 0) {
    local_d4 = this->wordIndex;
    local_c0._0_4_ = 2;
    local_120.name._M_dataplus._M_p._0_4_ = 1;
    identifierProgram(&local_78,this,nowProcedure,(int *)local_c0,(int *)&local_120);
    bVar3 = Node::operator==(&local_78,&nullNode);
    if (bVar3) {
      errorParsing(__return_storage_ptr__,this,&local_14c,-1,-1);
    }
    else {
      local_120.name._M_dataplus._M_p = (pointer)&local_120.name.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"varDescription","");
      to_ = &this->wordIndex;
      iVar4 = this->nodeCnt;
      this->nodeCnt = iVar4 + 1;
      local_148._0_4_ = iVar4;
      Node::Node((Node *)local_c0,&local_120.name,(int *)local_148,&local_14c,to_);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_120.name._M_dataplus._M_p != &local_120.name.field_2) {
        operator_delete(local_120.name._M_dataplus._M_p,
                        local_120.name.field_2._M_allocated_capacity + 1);
      }
      local_148._0_8_ = local_148 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_148,"var","");
      local_150 = this->nodeCnt;
      this->nodeCnt = local_150 + 1;
      Node::Node(&local_120,(string *)local_148,&local_150,&local_d4,&local_d4);
      std::vector<Node,std::allocator<Node>>::emplace_back<Node_const&>
                ((vector<Node,std::allocator<Node>> *)&local_98,&local_120);
      std::vector<Node,_std::allocator<Node>_>::~vector(&local_120.son);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_120.name._M_dataplus._M_p != &local_120.name.field_2) {
        operator_delete(local_120.name._M_dataplus._M_p,
                        local_120.name.field_2._M_allocated_capacity + 1);
      }
      local_d0 = __return_storage_ptr__;
      local_c8 = nowProcedure;
      if ((pointer)local_148._0_8_ != (pointer)(local_148 + 0x10)) {
        operator_delete((void *)local_148._0_8_,(ulong)(local_148._16_8_ + 1));
      }
      do {
        lVar6 = (long)this->wordIndex + 1;
        this->wordIndex = (int)lVar6;
        iVar4 = std::__cxx11::string::compare
                          ((char *)((this->words).super__Vector_base<Word,_std::allocator<Word>_>.
                                    _M_impl.super__Vector_impl_data._M_start + lVar6));
        if (iVar4 == 0) {
          iStack_7c = this->wordIndex;
          std::vector<Node,std::allocator<Node>>::emplace_back<Node_const&>
                    ((vector<Node,std::allocator<Node>> *)&local_98,&local_78);
          __return_storage_ptr__ = local_d0;
          local_148._0_8_ = local_148 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_148,";","");
          nowProcedure_00 = local_c8;
          local_150 = this->nodeCnt;
          this->nodeCnt = local_150 + 1;
          Node::Node(&local_120,(string *)local_148,&local_150,to_,to_);
          std::vector<Node,std::allocator<Node>>::emplace_back<Node_const&>
                    ((vector<Node,std::allocator<Node>> *)&local_98,&local_120);
          std::vector<Node,_std::allocator<Node>_>::~vector(&local_120.son);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_120.name._M_dataplus._M_p != &local_120.name.field_2) {
            operator_delete(local_120.name._M_dataplus._M_p,
                            local_120.name.field_2._M_allocated_capacity + 1);
          }
          if ((pointer)local_148._0_8_ != (pointer)(local_148 + 0x10)) {
            operator_delete((void *)local_148._0_8_,(ulong)(local_148._16_8_ + 1));
          }
          searchVariable(this,(Node *)local_c0,nowProcedure_00);
          ppiVar2 = &(this->generator).sizeStack.super__Vector_base<int,_std::allocator<int>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
          *ppiVar2 = *ppiVar2 + -1;
          paVar1 = &(__return_storage_ptr__->name).field_2;
          (__return_storage_ptr__->name)._M_dataplus._M_p = (pointer)paVar1;
          if ((undefined1 *)local_c0._0_8_ == local_c0 + 0x10) {
            paVar1->_M_allocated_capacity = CONCAT71(local_c0._17_7_,local_c0[0x10]);
            *(undefined8 *)((long)&(__return_storage_ptr__->name).field_2 + 8) = local_c0._24_8_;
          }
          else {
            (__return_storage_ptr__->name)._M_dataplus._M_p = (pointer)local_c0._0_8_;
            (__return_storage_ptr__->name).field_2._M_allocated_capacity =
                 CONCAT71(local_c0._17_7_,local_c0[0x10]);
          }
          (__return_storage_ptr__->name)._M_string_length = local_c0._8_8_;
          local_c0._8_8_ = 0;
          local_c0[0x10] = '\0';
          __return_storage_ptr__->id = local_c0._32_4_;
          (__return_storage_ptr__->son).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
          super__Vector_impl_data._M_start =
               local_98.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
               super__Vector_impl_data._M_start;
          (__return_storage_ptr__->son).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_98.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
               super__Vector_impl_data._M_finish;
          (__return_storage_ptr__->son).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               local_98.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
          local_98.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (pointer)0x0;
          local_98.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)0x0;
          local_98.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.super__Vector_impl_data.
          _M_finish = (pointer)0x0;
          __return_storage_ptr__->fr = local_80;
          __return_storage_ptr__->to = iStack_7c;
          local_c0._0_8_ = local_c0 + 0x10;
          goto LAB_00108411;
        }
        iVar5 = std::__cxx11::string::compare
                          ((char *)((this->words).super__Vector_base<Word,_std::allocator<Word>_>.
                                    _M_impl.super__Vector_impl_data._M_start + this->wordIndex));
        iVar4 = this->wordIndex;
        if (iVar5 != 0) {
          iVar5 = 0x18;
          goto LAB_0010837e;
        }
        iStack_7c = iVar4;
        std::vector<Node,std::allocator<Node>>::emplace_back<Node_const&>
                  ((vector<Node,std::allocator<Node>> *)&local_98,&local_78);
        local_148._0_8_ = local_148 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_148,",","");
        local_150 = this->nodeCnt;
        this->nodeCnt = local_150 + 1;
        Node::Node(&local_120,(string *)local_148,&local_150,to_,to_);
        std::vector<Node,std::allocator<Node>>::emplace_back<Node_const&>
                  ((vector<Node,std::allocator<Node>> *)&local_98,&local_120);
        std::vector<Node,_std::allocator<Node>_>::~vector(&local_120.son);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_120.name._M_dataplus._M_p != &local_120.name.field_2) {
          operator_delete(local_120.name._M_dataplus._M_p,
                          local_120.name.field_2._M_allocated_capacity + 1);
        }
        if ((undefined1 *)local_148._0_8_ != local_148 + 0x10) {
          operator_delete((void *)local_148._0_8_,(ulong)(local_148._16_8_ + 1));
        }
        local_150 = 2;
        local_d8 = 1;
        identifierProgram(&local_120,this,local_c8,&local_150,&local_d8);
        std::__cxx11::string::operator=((string *)&local_78,(string *)&local_120);
        local_148._16_8_ =
             local_78.son.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
        local_148._8_8_ =
             local_78.son.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
             super__Vector_impl_data._M_finish;
        local_148._0_8_ =
             local_78.son.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
             super__Vector_impl_data._M_start;
        local_78.id = local_120.id;
        local_78.son.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.super__Vector_impl_data
        ._M_start = local_120.son.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                    super__Vector_impl_data._M_start;
        local_78.son.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.super__Vector_impl_data
        ._M_finish = local_120.son.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                     super__Vector_impl_data._M_finish;
        local_78.son.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.super__Vector_impl_data
        ._M_end_of_storage =
             local_120.son.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
        local_120.son.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_120.son.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_120.son.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::vector<Node,_std::allocator<Node>_>::~vector
                  ((vector<Node,_std::allocator<Node>_> *)local_148);
        local_78.fr = local_120.fr;
        local_78.to = local_120.to;
        std::vector<Node,_std::allocator<Node>_>::~vector(&local_120.son);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_120.name._M_dataplus._M_p != &local_120.name.field_2) {
          operator_delete(local_120.name._M_dataplus._M_p,
                          local_120.name.field_2._M_allocated_capacity + 1);
        }
        bVar3 = Node::operator==(&local_78,&nullNode);
      } while (!bVar3);
      iVar4 = -1;
      iVar5 = -1;
LAB_0010837e:
      __return_storage_ptr__ = local_d0;
      errorParsing(local_d0,this,&local_14c,iVar4,iVar5);
LAB_00108411:
      std::vector<Node,_std::allocator<Node>_>::~vector(&local_98);
      if ((undefined1 *)local_c0._0_8_ != local_c0 + 0x10) {
        operator_delete((void *)local_c0._0_8_,CONCAT71(local_c0._17_7_,local_c0[0x10]) + 1);
      }
    }
    std::vector<Node,_std::allocator<Node>_>::~vector(&local_78.son);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78.name._M_dataplus._M_p != &local_78.name.field_2) {
      operator_delete(local_78.name._M_dataplus._M_p,local_78.name.field_2._M_allocated_capacity + 1
                     );
    }
  }
  else {
    errorParsing(__return_storage_ptr__,this,&local_14c,this->wordIndex,0x17);
  }
  return __return_storage_ptr__;
}

Assistant:

Node variableDesProgram(const int &nowProcedure) {
		generator.pushIndex();
		int beginIndex = wordIndex;

		if (words[++wordIndex].token != "var") return errorParsing(beginIndex, wordIndex, 23);
		int varIndex = wordIndex;

		Node varIdentifier = identifierProgram(nowProcedure, 2);
		if (varIdentifier == nullNode) return errorParsing(beginIndex);

		Node now = Node("varDescription", nodeCnt++, beginIndex, wordIndex);
		now.insertSon(Node("var", nodeCnt++, varIndex, varIndex));
		while (true) {
			wordIndex++;
			if (words[wordIndex].token == ";") {
				now.to = wordIndex;
				now.insertSon(varIdentifier);
				now.insertSon(Node(";", nodeCnt++, wordIndex, wordIndex));
				searchVariable(now, nowProcedure);

				generator.popIndex();
				return now;
			} else if (words[wordIndex].token == ",") {
				now.to = wordIndex;
				now.insertSon(varIdentifier);
				now.insertSon(Node(",", nodeCnt++, wordIndex, wordIndex));

				varIdentifier = identifierProgram(nowProcedure, 2);
				if (varIdentifier == nullNode) return errorParsing(beginIndex);
			} else return errorParsing(beginIndex, wordIndex, 24); // BASE ERROR
		}
	}